

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall wabt::SharedValidator::EndModule(SharedValidator *this)

{
  pointer pVVar1;
  Result RVar2;
  Enum EVar3;
  byte bVar4;
  pointer rhs;
  Var func_var;
  Var local_c0;
  Var local_78;
  
  rhs = (this->check_declared_funcs_).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (this->check_declared_funcs_).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (rhs == pVVar1) {
    EVar3 = Ok;
  }
  else {
    bVar4 = 0;
    do {
      Var::Var(&local_78,rhs);
      Var::Var(&local_c0,&local_78);
      RVar2 = CheckDeclaredFunc(this,&local_c0);
      bVar4 = bVar4 | RVar2.enum_ == Error;
      Var::~Var(&local_c0);
      Var::~Var(&local_78);
      rhs = rhs + 1;
    } while (rhs != pVVar1);
    EVar3 = (Enum)bVar4;
  }
  return (Result)EVar3;
}

Assistant:

Result SharedValidator::OnReturn(const Location& loc) {
  Result result = CheckInstr(Opcode::Return, loc);
  result |= typechecker_.OnReturn();
  return result;
}